

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_7zip.c
# Opt level: O1

ssize_t extract_pack_stream(archive_read *a,size_t minimum)

{
  long lVar1;
  size_t *psVar2;
  byte bVar3;
  uint32_t uVar4;
  _7zip_conflict *zip;
  unsigned_long uVar5;
  uint uVar6;
  Bool BVar7;
  int iVar8;
  uchar *puVar9;
  void *pvVar10;
  Bytef *__src;
  ssize_t sVar11;
  size_t sVar12;
  ulong uVar13;
  size_t sVar14;
  size_t sVar15;
  char *pcVar16;
  uint uVar17;
  ulong uVar18;
  uint64_t uVar19;
  uint64_t uVar20;
  byte *pbVar21;
  byte *pbVar22;
  uint uVar23;
  uchar *puVar24;
  size_t sVar25;
  byte *pbVar26;
  size_t sVar27;
  ulong uVar28;
  size_t sVar29;
  ulong in_R11;
  long lVar30;
  bool bVar31;
  bool bVar32;
  bool bVar33;
  ssize_t bytes_avail;
  uint local_dc;
  uint64_t local_b0;
  uchar *local_a8;
  uint64_t local_a0;
  ulong local_98;
  size_t local_90;
  size_t local_88;
  CPpmd7z_RangeDec *local_80;
  lzma_stream *local_78;
  code *local_70;
  IByteIn *local_68;
  uchar *local_60;
  size_t local_58;
  z_stream *local_50;
  CPpmd7 *local_48;
  code *local_40;
  size_t local_38;
  
  zip = (_7zip_conflict *)a->format->data;
  if ((zip->codec == 0) && (zip->codec2 == 0xffffffffffffffff)) {
    pvVar10 = __archive_read_ahead(a,minimum + (minimum == 0),(ssize_t *)&local_a0);
    if (0 < (long)local_a0 && pvVar10 != (void *)0x0) {
      if ((long)zip->pack_stream_inbytes_remaining < (long)local_a0) {
        local_a0 = zip->pack_stream_inbytes_remaining;
      }
      zip->pack_stream_inbytes_remaining = zip->pack_stream_inbytes_remaining - local_a0;
      if ((long)zip->folder_outbytes_remaining < (long)local_a0) {
        local_a0 = zip->folder_outbytes_remaining;
      }
      zip->folder_outbytes_remaining = zip->folder_outbytes_remaining - local_a0;
      zip->uncompressed_buffer_bytes_remaining = local_a0;
      return 0;
    }
    pcVar16 = "Truncated 7-Zip file body";
    iVar8 = 0x54;
    goto LAB_00163a03;
  }
  puVar9 = zip->uncompressed_buffer;
  local_58 = minimum;
  if (puVar9 == (uchar *)0x0) {
    sVar15 = 0x10000;
    if (0x10000 < minimum) {
      sVar15 = minimum + 0x3ff & 0xfffffffffffffc00;
    }
    zip->uncompressed_buffer_size = sVar15;
    puVar9 = (uchar *)malloc(sVar15);
    zip->uncompressed_buffer = puVar9;
    if (puVar9 == (uchar *)0x0) {
      pcVar16 = "No memory for 7-Zip decompression";
      iVar8 = 0xc;
      goto LAB_00163a03;
    }
LAB_00162dce:
    zip->uncompressed_buffer_bytes_remaining = 0;
  }
  else {
    if ((minimum <= zip->uncompressed_buffer_size) &&
       (minimum <= zip->uncompressed_buffer_bytes_remaining)) goto LAB_00162dce;
    lVar30 = (long)zip->uncompressed_buffer_pointer - (long)puVar9;
    if (zip->uncompressed_buffer_pointer == (uchar *)0x0) {
      lVar30 = 0;
    }
    if (zip->uncompressed_buffer_size < minimum) {
      uVar18 = minimum + 0x3ff & 0xfffffffffffffc00;
      puVar9 = (uchar *)realloc(puVar9,uVar18);
      if (puVar9 == (uchar *)0x0) {
        archive_set_error(&a->archive,0xc,"No memory for 7-Zip decompression");
        return -0x1e;
      }
      zip->uncompressed_buffer = puVar9;
      zip->uncompressed_buffer_size = uVar18;
    }
    if (lVar30 != 0) {
      memmove(zip->uncompressed_buffer,zip->uncompressed_buffer + lVar30,
              zip->uncompressed_buffer_bytes_remaining);
    }
  }
  zip->uncompressed_buffer_pointer = (uchar *)0x0;
  local_68 = &zip->bytein;
  local_80 = &zip->range_dec;
  local_70 = Ppmd7z_RangeDec_Init;
  local_40 = Ppmd7_DecodeSymbol;
  local_48 = &zip->ppmd7_context;
  local_50 = &zip->stream;
  local_78 = &zip->lzstream;
  local_60 = zip->odd_bcj;
  do {
    __src = (Bytef *)__archive_read_ahead(a,1,(ssize_t *)&local_a0);
    if ((long)local_a0 < 1) {
      iVar8 = 0x54;
      pcVar16 = "Truncated 7-Zip file body";
LAB_00162f85:
      archive_set_error(&a->archive,iVar8,pcVar16);
      iVar8 = 1;
    }
    else {
      local_38 = zip->uncompressed_buffer_size;
      local_88 = zip->uncompressed_buffer_bytes_remaining;
      puVar9 = zip->uncompressed_buffer + local_88;
      local_98 = local_38 - local_88;
      uVar18 = zip->pack_stream_inbytes_remaining;
      uVar19 = local_a0;
      if (uVar18 <= local_a0) {
        uVar19 = uVar18;
      }
      local_dc = 0;
      sVar27 = local_98;
      sVar29 = local_98;
      uVar20 = uVar19;
      local_a8 = puVar9;
      if ((zip->codec == 0x21) || (zip->codec2 != 0x3030103)) {
LAB_00163089:
        sVar12 = sVar27;
        puVar24 = local_a8;
        if (zip->codec2 == 0x303011b) {
          sVar12 = zip->tmp_stream_bytes_remaining;
          if (sVar12 != 0) {
            sVar11 = Bcj2_Decode(zip,local_a8,sVar27);
            if (sVar11 < 0) {
              bVar31 = false;
              archive_set_error(&a->archive,-1,"BCJ2 conversion Failed");
              in_R11 = 0xffffffe7;
            }
            else {
              zip->main_stream_bytes_remaining =
                   zip->main_stream_bytes_remaining + (zip->tmp_stream_bytes_remaining - sVar12);
              sVar12 = sVar27 - sVar11;
              if ((uVar18 == 0) || (sVar12 == 0)) {
                sVar29 = local_98 - sVar12;
                if (uVar18 == 0) {
                  if (zip->tmp_stream_bytes_remaining != 0) {
                    local_dc = 1;
                  }
                  uVar20 = 0;
                  bVar31 = false;
                  in_R11 = (ulong)local_dc;
                }
                else {
                  uVar20 = 0;
                  bVar31 = false;
                  in_R11 = (ulong)local_dc;
                }
              }
              else {
                in_R11 = in_R11 & 0xffffffff;
                local_a8 = local_a8 + sVar11;
                bVar31 = true;
                sVar27 = sVar12;
              }
            }
            if (!bVar31) goto LAB_00163745;
          }
          sVar12 = zip->tmp_stream_buff_size;
          puVar24 = zip->tmp_stream_buff;
        }
        uVar5 = zip->codec;
        if ((long)uVar5 < 0x30101) {
          if (uVar5 == 0) {
            uVar28 = sVar12;
            if (uVar19 < sVar12) {
              uVar28 = uVar19;
            }
            memcpy(puVar24,__src,uVar28);
            sVar25 = uVar19 - uVar28;
            sVar12 = sVar12 - uVar28;
            if (uVar18 == 0) {
              local_dc = 1;
            }
            goto LAB_001633db;
          }
          if (uVar5 == 0x21) goto LAB_00163254;
LAB_0016336c:
          archive_set_error(&a->archive,-1,"Decompression internal error");
          in_R11 = 0xffffffe7;
        }
        else {
          if (uVar5 == 0x30101) {
LAB_00163254:
            (zip->lzstream).next_in = __src;
            (zip->lzstream).avail_in = uVar19;
            (zip->lzstream).next_out = puVar24;
            (zip->lzstream).avail_out = sVar12;
            uVar6 = lzma_code(local_78,0);
            if (uVar6 != 0) {
              if (uVar6 != 1) {
                pcVar16 = "Decompression failed(%d)";
LAB_0016372c:
                archive_set_error(&a->archive,-1,pcVar16,(ulong)uVar6);
                in_R11 = 0xffffffe7;
                goto LAB_00163745;
              }
              lzma_end(local_78);
              zip->lzstream_valid = 0;
              local_dc = 1;
            }
            sVar25 = (zip->lzstream).avail_in;
            sVar12 = (zip->lzstream).avail_out;
          }
          else if (uVar5 == 0x30401) {
            sVar25 = uVar19;
            if (((zip->ppmd7_valid == 0) || (iVar8 = zip->ppmd7_stat, iVar8 < 0)) || (sVar12 == 0))
            {
              archive_set_error(&a->archive,-1,"Decompression internal error");
LAB_001633cd:
              bVar31 = false;
              in_R11 = 0xffffffe7;
            }
            else {
              (zip->ppstream).next_in = __src;
              (zip->ppstream).avail_in = uVar19;
              (zip->ppstream).next_out = puVar24;
              (zip->ppstream).avail_out = sVar12;
              if (iVar8 == 0) {
                (zip->bytein).a = a;
                (zip->bytein).Read = ppmd_read;
                (zip->range_dec).Stream = local_68;
                BVar7 = (*local_70)(local_80);
                if (BVar7 == 0) {
                  zip->ppmd7_stat = -1;
                  archive_set_error(&a->archive,-1,"Failed to initialize PPMd range decorder");
                }
                else {
                  if ((zip->ppstream).overconsumed == 0) {
                    zip->ppmd7_stat = 1;
                    in_R11 = in_R11 & 0xffffffff;
                    goto LAB_0016330d;
                  }
                  zip->ppmd7_stat = -1;
                }
                goto LAB_001633cd;
              }
LAB_0016330d:
              if (uVar18 == 0) {
                local_b0 = zip->folder_outbytes_remaining;
              }
              else {
                local_b0 = 0;
              }
              do {
                iVar8 = (*local_40)(local_48,&local_80->p);
                if (iVar8 < 0) {
                  zip->ppmd7_stat = -1;
                  bVar31 = false;
                  archive_set_error(&a->archive,0x54,"Failed to decode PPMd");
                  in_R11 = 0xffffffe7;
                }
                else if ((zip->ppstream).overconsumed == 0) {
                  in_R11 = in_R11 & 0xffffffff;
                  puVar24 = (zip->ppstream).next_out;
                  (zip->ppstream).next_out = puVar24 + 1;
                  *puVar24 = (uchar)iVar8;
                  (zip->ppstream).avail_out = (zip->ppstream).avail_out + -1;
                  (zip->ppstream).total_out = (zip->ppstream).total_out + 1;
                  bVar31 = local_b0 == 0;
                  local_b0 = local_b0 - 1;
                  if (bVar31) {
                    local_b0 = 0;
                  }
                  bVar31 = true;
                }
                else {
                  zip->ppmd7_stat = -1;
                  in_R11 = 0xffffffe7;
                  bVar31 = false;
                }
                if (!bVar31) {
                  bVar31 = false;
                  goto LAB_001633d2;
                }
                sVar14 = (zip->ppstream).avail_out;
              } while ((sVar14 != 0) && ((zip->ppstream).avail_in != 0 || local_b0 != 0));
              bVar31 = true;
              sVar12 = sVar14;
              sVar25 = (zip->ppstream).avail_in;
            }
LAB_001633d2:
            if (!bVar31) goto LAB_00163745;
          }
          else {
            if (uVar5 != 0x40108) goto LAB_0016336c;
            (zip->stream).next_in = __src;
            (zip->stream).avail_in = (uInt)uVar19;
            (zip->stream).next_out = puVar24;
            (zip->stream).avail_out = (uInt)sVar12;
            uVar6 = inflate(local_50,0);
            if (uVar6 != 0) {
              if (uVar6 != 1) {
                pcVar16 = "File decompression failed (%d)";
                goto LAB_0016372c;
              }
              local_dc = 1;
            }
            sVar25 = (size_t)(zip->stream).avail_in;
            sVar12 = (size_t)(zip->stream).avail_out;
          }
LAB_001633db:
          uVar28 = local_98 - sVar12;
          sVar29 = uVar28;
          if ((zip->codec != 0x21) && (zip->codec2 == 0x3030103)) {
            if (uVar28 < 5) {
              sVar29 = 0;
            }
            else {
              sVar14 = zip->bcj_prevPosT;
              uVar13 = (ulong)zip->bcj_prevMask;
              uVar4 = zip->bcj_ip;
              pbVar26 = puVar9 + (uVar28 - 4);
              local_88 = ((local_88 + sVar12) - local_38) + 5;
              sVar29 = 0;
              do {
                pbVar22 = puVar9 + sVar29;
                bVar31 = pbVar22 < pbVar26;
                if ((bVar31) && (bVar31 = true, (*pbVar22 & 0xfe) != 0xe8)) {
                  lVar30 = sVar29 + local_88;
                  pbVar21 = pbVar22;
                  do {
                    pbVar22 = pbVar26;
                    if (lVar30 == 0) break;
                    pbVar22 = pbVar21 + 1;
                    lVar30 = lVar30 + 1;
                    pbVar21 = pbVar22;
                  } while ((*pbVar22 & 0xfe) != 0xe8);
                  bVar31 = pbVar22 < pbVar26;
                }
                sVar29 = (long)pbVar22 - (long)puVar9;
                if (bVar31) {
                  sVar14 = sVar29 - sVar14;
                  if (sVar14 < 4) {
                    uVar6 = (int)uVar13 << ((char)sVar14 - 1U & 0x1f);
                    uVar23 = uVar6 & 7;
                    if (uVar23 == 0) goto LAB_0016352d;
                    bVar32 = (0xe8U >> uVar23 & 1) != 0;
                    bVar33 = (byte)(pbVar22[4 - (ulong)(byte)(&x86_Convert_kMaskToBitNumber)[uVar23]
                                           ] + 1) < 2;
                    uVar6 = (uVar6 & 3) * 2 + 1;
                    if (!bVar33 && !bVar32) {
                      uVar6 = uVar23;
                    }
                    uVar13 = (ulong)uVar6;
                    if (bVar33 || bVar32) {
                      sVar14 = sVar29;
                    }
                    sVar29 = sVar29 + (bVar33 || bVar32);
                    if (bVar33 || bVar32) goto LAB_001635ec;
                  }
                  else {
LAB_0016352d:
                    uVar13 = 0;
                  }
                  sVar14 = sVar29;
                  bVar3 = pbVar22[4];
                  if ((bVar3 == 0xff) || (bVar3 == 0)) {
                    uVar6 = (uint)pbVar22[1] |
                            (uint)pbVar22[2] << 8 | (uint)pbVar22[3] << 0x10 | (uint)bVar3 << 0x18;
                    do {
                      uVar23 = uVar6 - (uVar4 + (int)sVar14);
                      if ((uint)uVar13 == 0) {
                        bVar32 = false;
                      }
                      else {
                        uVar17 = uVar23 >> ((&x86_Convert_kMaskToBitNumber)[uVar13] * -8 + 0x18U &
                                           0x1f);
                        if (((char)uVar17 == -1) || ((uVar17 & 0xff) == 0)) {
                          uVar6 = ~(-1 << ((&x86_Convert_kMaskToBitNumber)[uVar13] * -8 & 0x1fU) ^
                                   uVar23);
                          bVar32 = true;
                        }
                        else {
                          bVar32 = false;
                        }
                      }
                    } while (bVar32);
                    pbVar22[4] = (byte)((int)(uVar23 * 0x80) >> 0x1f);
                    pbVar22[3] = (byte)(uVar23 >> 0x10);
                    pbVar22[2] = (byte)(uVar23 >> 8);
                    pbVar22[1] = (byte)uVar23;
                    sVar29 = sVar14 + 5;
                  }
                  else {
                    uVar13 = (ulong)(((uint)uVar13 & 3) * 2 + 1);
                    sVar29 = sVar14 + 1;
                  }
                }
LAB_001635ec:
              } while (bVar31);
              zip->bcj_prevPosT = sVar14;
              zip->bcj_prevMask = (uint32_t)uVar13;
              zip->bcj_ip = zip->bcj_ip + (int)sVar29;
              local_90 = sVar25;
            }
            sVar15 = uVar28 - sVar29;
            zip->odd_bcj_size = sVar15;
            if ((((sVar15 == 0) || (local_dc != 0)) || (4 < sVar15)) || (uVar18 == 0)) {
              zip->odd_bcj_size = 0;
              sVar29 = uVar28;
            }
            else {
              local_90 = sVar25;
              memcpy(local_60,puVar9 + sVar29,sVar15);
              sVar25 = local_90;
            }
          }
          uVar20 = uVar19 - sVar25;
          if (zip->codec2 == 0x303011b) {
            uVar18 = zip->tmp_stream_buff_size - sVar12;
            if (zip->main_stream_bytes_remaining <= uVar18) {
              uVar18 = zip->main_stream_bytes_remaining;
            }
            zip->tmp_stream_bytes_avail = uVar18;
            zip->tmp_stream_bytes_remaining = uVar18;
            sVar11 = Bcj2_Decode(zip,local_a8,sVar27);
            if (sVar11 < 0) {
              archive_set_error(&a->archive,-1,"BCJ2 conversion Failed");
              in_R11 = 0xffffffe7;
              goto LAB_00163745;
            }
            zip->main_stream_bytes_remaining =
                 zip->main_stream_bytes_remaining +
                 (zip->tmp_stream_bytes_remaining - zip->tmp_stream_bytes_avail);
            sVar29 = (local_98 - sVar27) + sVar11;
          }
          in_R11 = (ulong)local_dc;
        }
      }
      else {
        if ((local_98 < 5 && uVar18 != 0) && (zip->odd_bcj_size != 0)) {
          local_dc = 0;
          bVar31 = false;
          in_R11 = 0;
          sVar29 = 0;
          uVar20 = 0;
        }
        else {
          if (local_98 != 0 && zip->odd_bcj_size != 0) {
            lVar30 = 0;
            do {
              puVar9[lVar30] = zip->odd_bcj[lVar30];
              lVar1 = lVar30 + 1;
              psVar2 = &zip->odd_bcj_size;
              *psVar2 = *psVar2 - 1;
              if (*psVar2 == 0) break;
              bVar31 = local_98 - 1 != lVar30;
              lVar30 = lVar1;
            } while (bVar31);
            local_a8 = puVar9 + lVar1;
            sVar27 = local_98 - lVar1;
          }
          if ((uVar18 == 0) || (sVar27 == 0)) {
            in_R11 = (ulong)(uVar18 == 0);
            sVar29 = local_98 - sVar27;
            uVar20 = 0;
            bVar31 = false;
            local_dc = (uint)(uVar18 == 0);
          }
          else {
            local_dc = 0;
            bVar31 = true;
          }
        }
        if (bVar31) goto LAB_00163089;
      }
LAB_00163745:
      iVar8 = 1;
      if ((uint)in_R11 < 2) {
        uVar19 = zip->pack_stream_inbytes_remaining;
        zip->pack_stream_inbytes_remaining = uVar19 - uVar20;
        uVar18 = zip->folder_outbytes_remaining;
        uVar28 = uVar18;
        if (sVar29 < uVar18) {
          uVar28 = sVar29;
        }
        zip->folder_outbytes_remaining = uVar18 - uVar28;
        sVar27 = zip->uncompressed_buffer_bytes_remaining + uVar28;
        zip->uncompressed_buffer_bytes_remaining = sVar27;
        zip->pack_stream_bytes_unconsumed = uVar20;
        iVar8 = 2;
        if ((sVar27 != zip->uncompressed_buffer_size) &&
           ((((iVar8 = 2, zip->codec2 != 0x3030103 || (sVar27 + 5 <= zip->uncompressed_buffer_size))
             || (zip->odd_bcj_size == 0)) && ((uVar19 != uVar20 || (sVar29 < uVar18)))))) {
          if (((uint)in_R11 != 0) || (uVar28 == 0 && uVar20 == 0)) {
            iVar8 = -1;
            pcVar16 = "Damaged 7-Zip archive";
            goto LAB_00162f85;
          }
          read_consume(a);
          iVar8 = 0;
        }
      }
    }
  } while (iVar8 == 0);
  if (iVar8 != 2) {
    return -0x1e;
  }
  if (local_58 <= zip->uncompressed_buffer_bytes_remaining) {
    zip->uncompressed_buffer_pointer = zip->uncompressed_buffer;
    return 0;
  }
  pcVar16 = "Damaged 7-Zip archive";
  iVar8 = -1;
LAB_00163a03:
  archive_set_error(&a->archive,iVar8,pcVar16);
  return -0x1e;
}

Assistant:

static ssize_t
extract_pack_stream(struct archive_read *a, size_t minimum)
{
	struct _7zip *zip = (struct _7zip *)a->format->data;
	ssize_t bytes_avail;
	int r;

	if (zip->codec == _7Z_COPY && zip->codec2 == (unsigned long)-1) {
		if (minimum == 0)
			minimum = 1;
		if (__archive_read_ahead(a, minimum, &bytes_avail) == NULL
		    || bytes_avail <= 0) {
			archive_set_error(&a->archive,
			    ARCHIVE_ERRNO_FILE_FORMAT,
			    "Truncated 7-Zip file body");
			return (ARCHIVE_FATAL);
		}
		if (bytes_avail > (ssize_t)zip->pack_stream_inbytes_remaining)
			bytes_avail = (ssize_t)zip->pack_stream_inbytes_remaining;
		zip->pack_stream_inbytes_remaining -= bytes_avail;
		if (bytes_avail > (ssize_t)zip->folder_outbytes_remaining)
			bytes_avail = (ssize_t)zip->folder_outbytes_remaining;
		zip->folder_outbytes_remaining -= bytes_avail;
		zip->uncompressed_buffer_bytes_remaining = bytes_avail;
		return (ARCHIVE_OK);
	}

	/* If the buffer hasn't been allocated, allocate it now. */
	if (zip->uncompressed_buffer == NULL) {
		zip->uncompressed_buffer_size = UBUFF_SIZE;
		if (zip->uncompressed_buffer_size < minimum) {
			zip->uncompressed_buffer_size = minimum + 1023;
			zip->uncompressed_buffer_size &= ~0x3ff;
		}
		zip->uncompressed_buffer =
		    malloc(zip->uncompressed_buffer_size);
		if (zip->uncompressed_buffer == NULL) {
			archive_set_error(&a->archive, ENOMEM,
			    "No memory for 7-Zip decompression");
			return (ARCHIVE_FATAL);
		}
		zip->uncompressed_buffer_bytes_remaining = 0;
	} else if (zip->uncompressed_buffer_size < minimum ||
	    zip->uncompressed_buffer_bytes_remaining < minimum) {
		/*
		 * Make sure the uncompressed buffer can have bytes
		 * at least `minimum' bytes.
		 * NOTE: This case happen when reading the header.
		 */
		size_t used;
		if (zip->uncompressed_buffer_pointer != 0)
			used = zip->uncompressed_buffer_pointer -
				zip->uncompressed_buffer;
		else
			used = 0;
		if (zip->uncompressed_buffer_size < minimum) {
			/*
			 * Expand the uncompressed buffer up to
			 * the minimum size.
			 */
			void *p;
			size_t new_size;

			new_size = minimum + 1023;
			new_size &= ~0x3ff;
			p = realloc(zip->uncompressed_buffer, new_size);
			if (p == NULL) {
				archive_set_error(&a->archive, ENOMEM,
				    "No memory for 7-Zip decompression");
				return (ARCHIVE_FATAL);
			}
			zip->uncompressed_buffer = (unsigned char *)p;
			zip->uncompressed_buffer_size = new_size;
		}
		/*
		 * Move unconsumed bytes to the head.
		 */
		if (used) {
			memmove(zip->uncompressed_buffer,
				zip->uncompressed_buffer + used,
				zip->uncompressed_buffer_bytes_remaining);
		}
	} else
		zip->uncompressed_buffer_bytes_remaining = 0;
	zip->uncompressed_buffer_pointer = NULL;
	for (;;) {
		size_t bytes_in, bytes_out;
		const void *buff_in;
		unsigned char *buff_out;
		int end_of_data;

		/*
		 * Note: '1' here is a performance optimization.
		 * Recall that the decompression layer returns a count of
		 * available bytes; asking for more than that forces the
		 * decompressor to combine reads by copying data.
		 */
		buff_in = __archive_read_ahead(a, 1, &bytes_avail);
		if (bytes_avail <= 0) {
			archive_set_error(&a->archive,
			    ARCHIVE_ERRNO_FILE_FORMAT,
			    "Truncated 7-Zip file body");
			return (ARCHIVE_FATAL);
		}

		buff_out = zip->uncompressed_buffer
			+ zip->uncompressed_buffer_bytes_remaining;
		bytes_out = zip->uncompressed_buffer_size
			- zip->uncompressed_buffer_bytes_remaining;
		bytes_in = bytes_avail;
		if (bytes_in > zip->pack_stream_inbytes_remaining)
			bytes_in = (size_t)zip->pack_stream_inbytes_remaining;
		/* Drive decompression. */
		r = decompress(a, zip, buff_out, &bytes_out,
			buff_in, &bytes_in);
		switch (r) {
		case ARCHIVE_OK:
			end_of_data = 0;
			break;
		case ARCHIVE_EOF:
			end_of_data = 1;
			break;
		default:
			return (ARCHIVE_FATAL);
		}
		zip->pack_stream_inbytes_remaining -= bytes_in;
		if (bytes_out > zip->folder_outbytes_remaining)
			bytes_out = (size_t)zip->folder_outbytes_remaining;
		zip->folder_outbytes_remaining -= bytes_out;
		zip->uncompressed_buffer_bytes_remaining += bytes_out;
		zip->pack_stream_bytes_unconsumed = bytes_in;

		/*
		 * Continue decompression until uncompressed_buffer is full.
		 */
		if (zip->uncompressed_buffer_bytes_remaining ==
		    zip->uncompressed_buffer_size)
			break;
		if (zip->codec2 == _7Z_X86 && zip->odd_bcj_size &&
		    zip->uncompressed_buffer_bytes_remaining + 5 >
		    zip->uncompressed_buffer_size)
			break;
		if (zip->pack_stream_inbytes_remaining == 0 &&
		    zip->folder_outbytes_remaining == 0)
			break;
		if (end_of_data || (bytes_in == 0 && bytes_out == 0)) {
			archive_set_error(&(a->archive),
			    ARCHIVE_ERRNO_MISC, "Damaged 7-Zip archive");
			return (ARCHIVE_FATAL);
		}
		read_consume(a);
	}
	if (zip->uncompressed_buffer_bytes_remaining < minimum) {
		archive_set_error(&(a->archive),
		    ARCHIVE_ERRNO_MISC, "Damaged 7-Zip archive");
		return (ARCHIVE_FATAL);
	}
	zip->uncompressed_buffer_pointer = zip->uncompressed_buffer;
	return (ARCHIVE_OK);
}